

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderSetV2iAttribute(ImfHeader *hdr,char *name,int x,int y)

{
  undefined1 uVar1;
  iterator this;
  TypedAttribute<Imath_3_2::Vec2<int>_> *this_00;
  Vec2<int> *this_01;
  int in_ECX;
  int in_EDX;
  ImfHeader *in_RDI;
  char *in_stack_00000040;
  Header *in_stack_00000048;
  exception *e;
  V2i v;
  Attribute *in_stack_00000520;
  char *in_stack_00000528;
  Header *in_stack_00000530;
  Header *in_stack_ffffffffffffff38;
  TypedAttribute<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff68;
  Vec2<int> local_28 [3];
  ImfHeader *local_10;
  
  local_10 = in_RDI;
  Imath_3_2::Vec2<int>::Vec2(local_28,in_EDX,in_ECX);
  anon_unknown.dwarf_70604::header(local_10);
  Imf_3_4::Header::find(in_stack_00000048,in_stack_00000040);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  anon_unknown.dwarf_70604::header(local_10);
  this._M_node = (_Base_ptr)Imf_3_4::Header::end(in_stack_ffffffffffffff38);
  Imf_3_4::Header::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff40,(Iterator *)in_stack_ffffffffffffff38);
  uVar1 = Imf_3_4::operator==((ConstIterator *)in_stack_ffffffffffffff40,
                              (ConstIterator *)in_stack_ffffffffffffff38);
  if ((bool)uVar1) {
    anon_unknown.dwarf_70604::header(local_10);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::TypedAttribute
              (in_stack_ffffffffffffff40,(Vec2<int> *)in_stack_ffffffffffffff38);
    Imf_3_4::Header::insert(in_stack_00000530,in_stack_00000528,in_stack_00000520);
    Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_2::Vec2<int>_> *)0x19c7cb);
  }
  else {
    anon_unknown.dwarf_70604::header(local_10);
    this_00 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
                        ((Header *)this._M_node,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff68));
    this_01 = Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::value(this_00);
    Imath_3_2::Vec2<int>::operator=(this_01,local_28);
  }
  return 1;
}

Assistant:

int
ImfHeaderSetV2iAttribute (ImfHeader* hdr, const char name[], int x, int y)
{
    try
    {
        V2i v (x, y);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute (v));
        else
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute> (
                    name)
                .value () = v;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}